

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
SetupBackgroundSweep
          (HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          RecyclerSweep *recyclerSweep)

{
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  FreeObject *pFVar6;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this_00;
  undefined8 *in_FS_OFFSET;
  
  this_00 = &this->allocatorHead;
  while ((this_00->heapBlock == (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0 &&
         (pFVar6 = SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>
                   ::GetExplicitFreeList(this_00), pFVar6 == (FreeObject *)0x0))) {
    this_00 = this_00->next;
    if (this_00 == &this->allocatorHead) {
LAB_0021b280:
      pSVar1 = this->nextAllocableBlockHead;
      uVar5 = HeapInfo::GetMediumBucketIndex((ulong)(this->super_HeapBucket).sizeCat);
      (recyclerSweep->mediumLeafData).bucketData[uVar5].savedNextAllocableBlockHead = pSVar1;
      uVar5 = HeapInfo::GetMediumBucketIndex((ulong)(this->super_HeapBucket).sizeCat);
      if ((recyclerSweep->mediumLeafData).bucketData[uVar5].pendingSweepList !=
          (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar2 = (undefined4 *)*in_FS_OFFSET;
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                           ,0x65a,"(recyclerSweep.GetPendingSweepBlockList(this) == nullptr)",
                           "recyclerSweep.GetPendingSweepBlockList(this) == nullptr");
        if (!bVar4) {
LAB_0021b314:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar2 = 0;
      }
      StopAllocationBeforeSweep(this);
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar2 = (undefined4 *)*in_FS_OFFSET;
  *puVar2 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                     ,0x657,"(this->AllocatorsAreEmpty())","this->AllocatorsAreEmpty()");
  if (!bVar4) goto LAB_0021b314;
  *puVar2 = 0;
  goto LAB_0021b280;
}

Assistant:

void
HeapBucketT<TBlockType>::SetupBackgroundSweep(RecyclerSweep& recyclerSweep)
{
    // Don't allocate from existing block temporary when concurrent sweeping

    // Currently Rescan clear allocators, if we remove the uncollectedAllocBytes there, we can
    // avoid it there and do it here.
    Assert(this->AllocatorsAreEmpty());

    DebugOnly(recyclerSweep.SaveNextAllocableBlockHead(this));
    Assert(recyclerSweep.GetPendingSweepBlockList(this) == nullptr);

    this->StopAllocationBeforeSweep();
}